

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  BuiltStyledStreamWriter *this_00;
  char *pcVar5;
  Enum cs;
  Value *this_01;
  string colonSymbol;
  string nullSymbol;
  string endingLineFeedSymbol;
  string cs_str;
  string indentation;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_01 = &this->settings_;
  pVVar4 = Value::operator[](this_01,"indentation");
  Value::asString_abi_cxx11_(&local_50,pVVar4);
  pVVar4 = Value::operator[](this_01,"commentStyle");
  Value::asString_abi_cxx11_(&local_70,pVVar4);
  pVVar4 = Value::operator[](this_01,"enableYAMLCompatibility");
  bVar1 = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_01,"dropNullPlaceholders");
  bVar2 = Value::asBool(pVVar4);
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  cs = All;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 == 0) {
      cs = None;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"commentStyle must be \'All\' or \'None\'","");
      throwRuntimeError(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," : ","");
  if (bVar1) {
    pcVar5 = ": ";
  }
  else {
    if (local_50._M_string_length != 0) goto LAB_001470e2;
    pcVar5 = ":";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_d0,0,(char *)local_d0._M_string_length,(ulong)pcVar5);
LAB_001470e2:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"null","");
  if (bVar2) {
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x14f2b5);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe0);
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&local_50,cs,&local_d0,&local_b0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const
{
  std::string indentation = settings_["indentation"].asString();
  std::string cs_str = settings_["commentStyle"].asString();
  bool eyc = settings_["enableYAMLCompatibility"].asBool();
  bool dnp = settings_["dropNullPlaceholders"].asBool();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  std::string colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  std::string nullSymbol = "null";
  if (dnp) {
    nullSymbol = "";
  }
  std::string endingLineFeedSymbol = "";
  return new BuiltStyledStreamWriter(
      indentation, cs,
      colonSymbol, nullSymbol, endingLineFeedSymbol);
}